

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall QTextDocumentPrivate::endEditBlock(QTextDocumentPrivate *this)

{
  int *piVar1;
  byte bVar2;
  QTextUndoCommand *pQVar3;
  ulong uVar4;
  pointer pQVar5;
  
  piVar1 = &this->editBlock;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if ((this->undoEnabled == true) && (0 < (long)this->undoState)) {
    uVar4 = (long)this->undoState - 1;
    pQVar3 = (this->undoStack).d.ptr;
    if ((pQVar3[uVar4].field_0x2 & 1) != 0) {
      bVar2 = pQVar3[uVar4 & 0xffffffff].field_0x2;
      pQVar5 = QList<QTextUndoCommand>::data(&this->undoStack);
      pQVar5[uVar4].field_0x2 = pQVar5[uVar4].field_0x2 | 2;
      if ((bVar2 & 2) == 0) {
        QTextDocument::undoCommandAdded(*(QTextDocument **)&this->field_0x8);
      }
    }
  }
  this->editBlockCursorPosition = -1;
  finishEdit(this);
  return;
}

Assistant:

void QTextDocumentPrivate::endEditBlock()
{
    Q_ASSERT(editBlock > 0);
    if (--editBlock)
        return;

    if (undoEnabled && undoState > 0) {
        const bool wasBlocking = !undoStack.at(undoState - 1).block_end;
        if (undoStack.at(undoState - 1).block_part) {
            undoStack[undoState - 1].block_end = true;
            if (wasBlocking)
                emit document()->undoCommandAdded();
        }
    }

    editBlockCursorPosition = -1;

    finishEdit();
}